

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<int> * __thiscall
testing::internal::ComparisonBase::operator_cast_to_Matcher
          (Matcher<int> *__return_storage_ptr__,ComparisonBase *this)

{
  MatcherInterface<int> *pMVar1;
  
  pMVar1 = (MatcherInterface<int> *)operator_new(0x10);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_0017abc8;
  *(undefined4 *)&pMVar1[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       *(undefined4 *)this;
  (__return_storage_ptr__->super_MatcherBase<int>).impl_.value_ = pMVar1;
  (__return_storage_ptr__->super_MatcherBase<int>).impl_.link_.next_ =
       &(__return_storage_ptr__->super_MatcherBase<int>).impl_.link_;
  (__return_storage_ptr__->super_MatcherBase<int>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0017a8c0;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Lhs>() const {
    return MakeMatcher(new Impl<Lhs>(rhs_));
  }